

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

void __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::AppendSegmentInternal
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l,
          unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *segment)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  pointer pSVar2;
  pointer pSVar3;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> uVar4;
  reference pvVar5;
  pointer pRVar6;
  bool bVar7;
  SegmentNode<duckdb::RowGroup> node;
  SegmentNode<duckdb::RowGroup> local_30;
  
  if ((this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var1._M_head_impl =
         (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
         super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    pvVar5 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::back(&this->nodes);
    pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       (&pvVar5->node);
    LOCK();
    (pRVar6->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = _Var1._M_head_impl;
    UNLOCK();
  }
  local_30.node.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
       (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
  pSVar2 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  (pRVar6->super_SegmentBase<duckdb::RowGroup>).index = (long)pSVar3 - (long)pSVar2 >> 4;
  pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  LOCK();
  (pRVar6->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  uVar4.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)local_30.node;
  local_30.row_start = (pRVar6->super_SegmentBase<duckdb::RowGroup>).start;
  _Var1._M_head_impl =
       (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
       super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
       super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
  bVar7 = local_30.node.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
          _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
          super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
  local_30.node.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)_Var1._M_head_impl;
  if (bVar7) {
    RowGroup::~RowGroup((RowGroup *)
                        uVar4.
                        super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
                        _M_t.
                        super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                        .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
    operator_delete((void *)uVar4.
                            super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                            .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,std::allocator<duckdb::SegmentNode<duckdb::RowGroup>>>
  ::emplace_back<duckdb::SegmentNode<duckdb::RowGroup>>
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,std::allocator<duckdb::SegmentNode<duckdb::RowGroup>>>
              *)&this->nodes,&local_30);
  uVar4.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)local_30.node;
  if (local_30.node.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0) {
    RowGroup::~RowGroup((RowGroup *)
                        local_30.node.
                        super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
                        _M_t.
                        super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                        .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
    operator_delete((void *)uVar4.
                            super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                            .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void AppendSegmentInternal(SegmentLock &l, unique_ptr<T> segment) {
		D_ASSERT(segment);
		// add the node to the list of nodes
		if (!nodes.empty()) {
			nodes.back().node->next = segment.get();
		}
		SegmentNode<T> node;
		segment->index = nodes.size();
		segment->next = nullptr;
		node.row_start = segment->start;
		node.node = std::move(segment);
		nodes.push_back(std::move(node));
	}